

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O3

void deliver_by_window(qtmsg *qt_msg)

{
  nh_menuitem *pnVar1;
  size_t sVar2;
  long lVar3;
  int icount;
  long lVar4;
  menulist menu;
  char xbuf [256];
  menulist local_148;
  char local_138 [264];
  
  init_menulist(&local_148);
  icount = local_148.icount;
  if (0 < qt_msg->size) {
    lVar4 = 0;
    do {
      dlb_fgets(local_138,0x50,msg_file);
      xcrypt(local_138,in_line);
      convert_line();
      lVar3 = (long)local_148.size;
      if (local_148.size <= local_148.icount) {
        local_148.size = local_148.size * 2;
        local_148.items = (nh_menuitem *)realloc(local_148.items,lVar3 * 0x218);
      }
      pnVar1 = local_148.items + local_148.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,out_line);
      icount = local_148.icount + 1;
      local_148.icount = icount;
      sVar2 = strlen(in_line);
      lVar4 = lVar4 + sVar2;
    } while (lVar4 < qt_msg->size);
  }
  display_menu(local_148.items,icount,(char *)0x0,0,(int *)0x0);
  free(local_148.items);
  return;
}

Assistant:

static void deliver_by_window(struct qtmsg *qt_msg)
{
	long size;
	char xbuf[BUFSZ];
	struct menulist menu;
	init_menulist(&menu);

	for (size = 0; size < qt_msg->size; size += (long)strlen(in_line)) {
	    dlb_fgets(xbuf, 80, msg_file);
	    xcrypt(xbuf, in_line);
	    convert_line();
	    add_menutext(&menu, out_line);
	}
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
	free(menu.items);
}